

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O3

void __thiscall
kratos::Property::edge(Property *this,EventEdgeType type,shared_ptr<kratos::Var> *var)

{
  int iVar1;
  VarException *this_00;
  initializer_list<const_kratos::IRNode_*> __l;
  element_type *local_68;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_60;
  undefined1 local_48 [39];
  allocator_type local_21;
  
  iVar1 = (*(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[7])();
  if (iVar1 == 1) {
    EventControl::EventControl
              ((EventControl *)local_48,type,
               (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    *(ulong *)((long)&(this->edge_).var + 4) = CONCAT44(local_48._16_4_,local_48._12_4_);
    (this->edge_).edge = local_48._20_4_;
    (this->edge_).delay_side = local_48._24_4_;
    (this->edge_).delay = local_48._0_8_;
    (this->edge_).var = (Var *)CONCAT44(local_48._12_4_,local_48._8_4_);
    return;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  local_48._0_8_ = local_48 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"{0} should be width 1","");
  local_68 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_68;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_60,__l,&local_21);
  VarException::VarException(this_00,(string *)local_48,&local_60);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Property::edge(kratos::EventEdgeType type, const std::shared_ptr<Var> &var) {
    if (var->width() != 1) throw VarException("{0} should be width 1", {var.get()});
    edge_ = EventControl(type, *var);
}